

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# suffix_array.hpp
# Opt level: O0

void __thiscall
suffix_array<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_unsigned_long,_true>
::isa_2b_to_sa(suffix_array<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_unsigned_long,_true>
               *this,vector<unsigned_long,_std::allocator<unsigned_long>_> *param_1)

{
  value_type vVar1;
  size_type sVar2;
  MPI_Comm poVar3;
  reference pvVar4;
  reference pvVar5;
  ulong uVar6;
  unsigned_long uVar7;
  allocator local_e9;
  string local_e8;
  ulong local_c8;
  size_t i_1;
  string local_b8;
  TwoBSA<unsigned_long> *local_98;
  __normal_iterator<TwoBSA<unsigned_long>_*,_std::vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>_>
  local_90;
  allocator local_81;
  string local_80;
  ulong local_60;
  size_t i;
  size_t str_offset;
  allocator<TwoBSA<unsigned_long>_> local_39;
  undefined1 local_38 [8];
  vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_> tuple_vec;
  section_timer timer;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_B2_local;
  suffix_array<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_unsigned_long,_true>
  *this_local;
  
  sVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(param_1);
  if (sVar2 != this->local_size) {
    __assert_fail("local_B2.size() == local_size",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/include/suffix_array.hpp"
                  ,0x339,
                  "void suffix_array<__gnu_cxx::__normal_iterator<char *, std::basic_string<char>>, unsigned long, true>::isa_2b_to_sa(std::vector<index_t> &) [InputIterator = __gnu_cxx::__normal_iterator<char *, std::basic_string<char>>, index_t = unsigned long, _CONSTRUCT_LCP = true]"
                 );
  }
  poVar3 = mxx::comm::operator_cast_to_ompi_communicator_t_(&this->comm);
  mxx::empty_section_timer_impl::empty_section_timer_impl
            ((empty_section_timer_impl *)
             ((long)&tuple_vec.
                     super__Vector_base<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7),(ostream *)&std::cerr,
             poVar3,0);
  sVar2 = this->local_size;
  std::allocator<TwoBSA<unsigned_long>_>::allocator(&local_39);
  std::vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>::vector
            ((vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_> *)local_38,
             sVar2,&local_39);
  std::allocator<TwoBSA<unsigned_long>_>::~allocator(&local_39);
  i = mxx::partition::block_decomposition_buffered<unsigned_long>::excl_prefix_size(&this->part);
  local_60 = 0;
  while( true ) {
    if (this->local_size <= local_60) {
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::clear(&this->local_B);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::shrink_to_fit(&this->local_B);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::clear(param_1);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::shrink_to_fit(param_1);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::clear(&this->local_SA);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::shrink_to_fit(&this->local_SA);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_80,"isa2sa_tupleize",&local_81);
      mxx::empty_section_timer_impl::end_section
                ((empty_section_timer_impl *)
                 ((long)&tuple_vec.
                         super__Vector_base<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage + 7),&local_80);
      std::__cxx11::string::~string((string *)&local_80);
      std::allocator<char>::~allocator((allocator<char> *)&local_81);
      local_90._M_current =
           (TwoBSA<unsigned_long> *)
           std::vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>::begin
                     ((vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_> *)
                      local_38);
      local_98 = (TwoBSA<unsigned_long> *)
                 std::vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>::end
                           ((vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>
                             *)local_38);
      mxx::
      sort<__gnu_cxx::__normal_iterator<TwoBSA<unsigned_long>*,std::vector<TwoBSA<unsigned_long>,std::allocator<TwoBSA<unsigned_long>>>>>
                (local_90,(__normal_iterator<TwoBSA<unsigned_long>_*,_std::vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>_>
                           )local_98,&this->comm);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_b8,"isa2sa_samplesort",(allocator *)((long)&i_1 + 7));
      mxx::empty_section_timer_impl::end_section
                ((empty_section_timer_impl *)
                 ((long)&tuple_vec.
                         super__Vector_base<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage + 7),&local_b8);
      std::__cxx11::string::~string((string *)&local_b8);
      std::allocator<char>::~allocator((allocator<char> *)((long)&i_1 + 7));
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
                (&this->local_B,this->local_size);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize(param_1,this->local_size);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
                (&this->local_SA,this->local_size);
      for (local_c8 = 0; local_c8 < this->local_size; local_c8 = local_c8 + 1) {
        pvVar5 = std::vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>::
                 operator[]((vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>
                             *)local_38,local_c8);
        uVar7 = pvVar5->B1;
        pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                           (&this->local_B,local_c8);
        *pvVar4 = uVar7;
        pvVar5 = std::vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>::
                 operator[]((vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>
                             *)local_38,local_c8);
        uVar7 = pvVar5->B2;
        pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                           (param_1,local_c8);
        *pvVar4 = uVar7;
        pvVar5 = std::vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>::
                 operator[]((vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>
                             *)local_38,local_c8);
        uVar7 = pvVar5->SA;
        pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                           (&this->local_SA,local_c8);
        *pvVar4 = uVar7;
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_e8,"isa2sa_untupleize",&local_e9);
      mxx::empty_section_timer_impl::end_section
                ((empty_section_timer_impl *)
                 ((long)&tuple_vec.
                         super__Vector_base<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage + 7),&local_e8);
      std::__cxx11::string::~string((string *)&local_e8);
      std::allocator<char>::~allocator((allocator<char> *)&local_e9);
      std::vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>::~vector
                ((vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_> *)local_38)
      ;
      return;
    }
    pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       (&this->local_B,local_60);
    vVar1 = *pvVar4;
    pvVar5 = std::vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>::operator[]
                       ((vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_> *)
                        local_38,local_60);
    pvVar5->B1 = vVar1;
    pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       (param_1,local_60);
    vVar1 = *pvVar4;
    pvVar5 = std::vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>::operator[]
                       ((vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_> *)
                        local_38,local_60);
    pvVar5->B2 = vVar1;
    uVar6 = i + local_60;
    uVar7 = std::numeric_limits<unsigned_long>::max();
    if (uVar7 <= uVar6) break;
    uVar7 = i + local_60;
    pvVar5 = std::vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>::operator[]
                       ((vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_> *)
                        local_38,local_60);
    pvVar5->SA = uVar7;
    local_60 = local_60 + 1;
  }
  __assert_fail("str_offset + i < std::numeric_limits<index_t>::max()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/include/suffix_array.hpp"
                ,0x349,
                "void suffix_array<__gnu_cxx::__normal_iterator<char *, std::basic_string<char>>, unsigned long, true>::isa_2b_to_sa(std::vector<index_t> &) [InputIterator = __gnu_cxx::__normal_iterator<char *, std::basic_string<char>>, index_t = unsigned long, _CONSTRUCT_LCP = true]"
               );
}

Assistant:

void isa_2b_to_sa(std::vector<index_t>& local_B2) {
    assert(local_B2.size() == local_size);
    SAC_TIMER_START();

    // convert the struct of arrays (local_SA, local_B, etc) into
    // array of structs (TwoBSA {.B1, .B2, .SA}) for sorting purposes

    // initialize tuple array
    std::vector<TwoBSA<index_t> > tuple_vec(local_size);

    // get global index offset
    std::size_t str_offset = part.excl_prefix_size();

    // fill tuple vector
    for (std::size_t i = 0; i < local_size; ++i) {
        tuple_vec[i].B1 = local_B[i];
        tuple_vec[i].B2 = local_B2[i];
        assert(str_offset + i < std::numeric_limits<index_t>::max());
        tuple_vec[i].SA = str_offset + i;
    }

    // release memory of input (to remain at the minimum 6x words memory usage)
    local_B.clear(); local_B.shrink_to_fit();
    local_B2.clear(); local_B2.shrink_to_fit();
    local_SA.clear(); local_SA.shrink_to_fit();

    SAC_TIMER_END_SECTION("isa2sa_tupleize");

    // parallel, distributed sample-sorting of tuples (B1, B2, SA)
    mxx::sort(tuple_vec.begin(), tuple_vec.end(), comm);

    SAC_TIMER_END_SECTION("isa2sa_samplesort");

    // reallocate output
    local_B.resize(local_size);
    local_B2.resize(local_size);
    local_SA.resize(local_size);

    // back convert array of structs into struct of arrays

    // read back into input vectors
    for (std::size_t i = 0; i < local_size; ++i) {
        local_B[i] = tuple_vec[i].B1;
        local_B2[i] = tuple_vec[i].B2;
        local_SA[i] = tuple_vec[i].SA;
    }
    SAC_TIMER_END_SECTION("isa2sa_untupleize");
}